

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

int SBPL_FPRINTALL(FILE *file,char *format,...)

{
  char *__s;
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  char buffer [1024];
  undefined8 local_4e8;
  void **local_4e0;
  undefined1 *local_4d8;
  undefined1 local_4c8 [16];
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined8 local_438;
  undefined8 local_428;
  char acStack_419 [1033];
  
  local_4d8 = local_4c8;
  if (in_AL != '\0') {
    local_498 = in_XMM0_Qa;
    local_488 = in_XMM1_Qa;
    local_478 = in_XMM2_Qa;
    local_468 = in_XMM3_Qa;
    local_458 = in_XMM4_Qa;
    local_448 = in_XMM5_Qa;
    local_438 = in_XMM6_Qa;
    local_428 = in_XMM7_Qa;
  }
  local_4e0 = &args[0].overflow_arg_area;
  local_4e8 = 0x3000000010;
  local_4b8 = in_RDX;
  local_4b0 = in_RCX;
  local_4a8 = in_R8;
  local_4a0 = in_R9;
  if ((_stdout == file) && (sbpl_print_fp != (SBPL_PRINT_TEXT_FP)0x0)) {
    __s = acStack_419 + 1;
    memset(__s,0,0x400);
    iVar1 = vsnprintf(__s,0x3ff,format,&local_4e8);
    if (iVar1 < 0) {
      printf("SBPL_PRINTALL::ERROR, could not complete call to vsnprintf()");
    }
    else {
      if (iVar1 == 0x400) {
        printf("SBPL_PRINTALL::ERROR, SBPL_PRINTF_BUFFER_SIZE: %d not large enough",0x400);
      }
      if (__s[(long)iVar1 + -1] == '\n') {
        acStack_419[iVar1] = '\0';
      }
      (*sbpl_print_fp)(0,acStack_419 + 1);
    }
  }
  else {
    iVar1 = vfprintf((FILE *)file,format,&local_4e8);
  }
  return iVar1;
}

Assistant:

int SBPL_FPRINTALL(FILE* file, const char* format, ...)
{
	int retVal = 0;
    va_list args;
    va_start(args, format);
    if ((file == stdout) && (sbpl_print_fp != NULL)) {
        char buffer[SBPL_PRINTF_BUFFER_SIZE] = {0};
        retVal = vsnprintf(buffer,SBPL_PRINTF_BUFFER_SIZE-1,format, args);
        if (retVal < 0) {
            printf("SBPL_PRINTALL::ERROR, could not complete call to vsnprintf()");
        }
        else {
            if (retVal == SBPL_PRINTF_BUFFER_SIZE) {
                printf("SBPL_PRINTALL::ERROR, SBPL_PRINTF_BUFFER_SIZE: %d not large enough", SBPL_PRINTF_BUFFER_SIZE);
            }
            if(buffer[retVal-1] == '\n') { // Remove newline
                    buffer[retVal-1] = '\0';
            }
            sbpl_print_fp(SBPL_LEVEL_NONE, &buffer[0]);
        }
    }
    else {
        retVal = vfprintf(file, format, args);
    }
    va_end (args);
    return retVal;
}